

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_resample.c
# Opt level: O3

void resamplefrom_dsp(t_resample *x,t_sample *in,int insize,int outsize,int method)

{
  t_sample *out;
  
  if (insize == outsize) {
    freebytes(x->s_vec,(long)x->s_n << 2);
    x->s_n = 0;
    x->s_vec = in;
    return;
  }
  out = x->s_vec;
  if (x->s_n != outsize) {
    freebytes(out,(long)x->s_n << 2);
    out = (t_sample *)getbytes((long)outsize << 2);
    x->s_vec = out;
    x->s_n = outsize;
  }
  resample_dsp(x,in,insize,out,outsize,method);
  return;
}

Assistant:

void resamplefrom_dsp(t_resample *x,
                           t_sample *in,
                           int insize, int outsize, int method)
{
  if (insize==outsize) {
   t_freebytes(x->s_vec, x->s_n * sizeof(*x->s_vec));
    x->s_n = 0;
    x->s_vec = in;
    return;
  }

  if (x->s_n != outsize) {
    t_sample *buf=x->s_vec;
    t_freebytes(buf, x->s_n * sizeof(*buf));
    buf = (t_sample *)t_getbytes(outsize * sizeof(*buf));
    x->s_vec = buf;
    x->s_n   = outsize;
  }

  resample_dsp(x, in, insize, x->s_vec, x->s_n, method);
  return;
}